

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDPF.cpp
# Opt level: O3

void __thiscall EDPF::validateEdgeSegments(EDPF *this)

{
  int iVar1;
  pointer pvVar2;
  int iVar3;
  double *__s;
  short *psVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  
  this->divForTestSegment = 2.25;
  iVar6 = 0;
  memset((this->super_ED).edgeImg,0,(long)(this->super_ED).height * (long)(this->super_ED).width);
  __s = (double *)operator_new__(0x40000);
  this->H = __s;
  memset(__s,0,0x40000);
  psVar4 = ComputePrewitt3x3(this);
  this->gradImg = psVar4;
  this->np = 0;
  iVar1 = (this->super_ED).segmentNos;
  if (0 < (long)iVar1) {
    pvVar2 = (this->super_ED).segmentPoints.
             super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar5 = 0;
    do {
      iVar3 = (int)((ulong)(*(long *)((long)&(pvVar2->
                                             super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                             )._M_impl.super__Vector_impl_data + lVar5 + 8) -
                           *(long *)((long)&(pvVar2->
                                            super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                            )._M_impl.super__Vector_impl_data + lVar5)) >> 3);
      iVar6 = iVar6 + ((iVar3 + -1) * iVar3) / 2;
      lVar5 = lVar5 + 0x18;
    } while ((long)iVar1 * 0x18 != lVar5);
    this->np = iVar6;
    if (0 < iVar1) {
      lVar7 = 8;
      lVar5 = 0;
      do {
        pvVar2 = (this->super_ED).segmentPoints.
                 super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        TestSegment(this,(int)lVar5,0,
                    (int)((ulong)(*(long *)((long)&(pvVar2->
                                                  super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                                  )._M_impl.super__Vector_impl_data + lVar7) -
                                 *(long *)((long)pvVar2 + lVar7 + -8)) >> 3) + -1);
        lVar5 = lVar5 + 1;
        lVar7 = lVar7 + 0x18;
      } while (lVar5 < (this->super_ED).segmentNos);
    }
  }
  ExtractNewSegments(this);
  if (this->H != (double *)0x0) {
    operator_delete__(this->H);
  }
  if (this->gradImg != (short *)0x0) {
    operator_delete__(this->gradImg);
    return;
  }
  return;
}

Assistant:

void EDPF::validateEdgeSegments()
{
	divForTestSegment = 2.25; // Some magic number :-)
	memset(edgeImg, 0, width*height); // clear edge image
	
	H = new double[MAX_GRAD_VALUE];
	memset(H, 0, sizeof(double)*MAX_GRAD_VALUE);

	gradImg = ComputePrewitt3x3();

	// Compute np: # of segment pieces
#if 1
	// Does this underestimate the number of pieces of edge segments?
	// What's the correct value?
	np = 0;
	for (int i = 0; i < segmentNos; i++) {
		int len = (int)segmentPoints[i].size();
		np += (len*(len - 1)) / 2;
	} //end-for

	  //  np *= 32;
#elif 0
	// This definitely overestimates the number of pieces of edge segments
	int np = 0;
	for (int i = 0; i < segmentNos; i++) {
		np += segmentPoints[i].size();
	} //end-for
	np = (np*(np - 1)) / 2;
#endif

	// Validate segments
	for (int i = 0; i< segmentNos; i++) {
		TestSegment(i, 0, (int)segmentPoints[i].size() - 1);
	} //end-for

	ExtractNewSegments();

	// clean space		  
	delete[] H;
	delete[] gradImg;
}